

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::push_back
          (SmallVector<unsigned_int,_2UL> *this,uint *value)

{
  bool bVar1;
  pointer this_00;
  uint *value_local;
  SmallVector<unsigned_int,_2UL> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->large_data_);
  if ((!bVar1) && (this->size_ == 2)) {
    MoveToLargeData(this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->large_data_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator->(&this->large_data_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,value);
  }
  else {
    this->small_data_[this->size_] = *value;
    this->size_ = this->size_ + 1;
  }
  return;
}

Assistant:

void push_back(const T& value) {
    if (!large_data_ && size_ == small_size) {
      MoveToLargeData();
    }

    if (large_data_) {
      large_data_->push_back(value);
      return;
    }

    new (small_data_ + size_) T(value);
    ++size_;
  }